

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk84(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk84 *peVar1;
  int local_2c;
  int i;
  envy_bios_power_unk84 *unk84;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk84;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk84.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse LOW POWER MS table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).unk84.version);
    }
    else {
      fprintf((FILE *)out,"LOW POWER MS table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).unk84.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).unk84.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; local_2c < (int)(uint)(bios->power).unk84.entriesnum;
          local_2c = local_2c + 1) {
        envy_bios_dump_hex(bios,out,(bios->power).unk84.entries[local_2c].offset,
                           (uint)(bios->power).unk84.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk84(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk84 *unk84 = &bios->power.unk84;
	int i;

	if (!unk84->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk84->valid) {
		fprintf(out, "Failed to parse LOW POWER MS table at 0x%x, version %x\n", unk84->offset, unk84->version);
		return;
	}

	fprintf(out, "LOW POWER MS table at 0x%x, version %x\n", unk84->offset, unk84->version);
	envy_bios_dump_hex(bios, out, unk84->offset, unk84->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk84->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk84->entries[i].offset, unk84->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}